

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_star_acl.c
# Opt level: O3

void test_compat_star_acl_posix1e(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  archive_entry *ae;
  char name [33];
  archive_entry *local_60;
  char local_58 [40];
  
  builtin_strncpy(local_58 + 0x10,"_acl_posix1e.tar",0x11);
  builtin_strncpy(local_58,"test_compat_star",0x10);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                   ,L'ï',(uint)(a != (archive_conflict *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                      ,L'ð',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                      ,L'ñ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  extract_reference_file(local_58);
  wVar2 = archive_read_open_filename(a,local_58,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                      ,L'ô',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)"
                      ,a);
  iVar1 = archive_read_next_header((archive *)a,&local_60);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                   ,L'÷',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  failure("One extended ACL should flag all ACLs to be returned.");
  wVar2 = archive_entry_acl_reset(local_60,L'Ā');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                      ,L'ú',5,"5",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
             ,L'ü',local_60,(archive_test_acl_t *)acls0,L'\x05',L'Ā',L'b');
  mVar3 = archive_entry_mode(local_60);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar3 & 0x1ff));
  mVar3 = archive_entry_mode(local_60);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                   ,L'ÿ',(uint)((mVar3 & 0x1ff) == 0x62),"(archive_entry_mode(ae) & 0777) == 0142",
                   (void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_60);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                   ,L'Ă',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  wVar2 = archive_entry_acl_reset(local_60,L'Ā');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                      ,L'Ą',7,"7",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
             ,L'Ć',local_60,(archive_test_acl_t *)acls1,L'\a',L'Ā',L'ţ');
  mVar3 = archive_entry_mode(local_60);
  failure("Basic ACLs should set mode to 0543, not %04o",(ulong)(mVar3 & 0x1ff));
  mVar3 = archive_entry_mode(local_60);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                   ,L'ĉ',(uint)((mVar3 & 0x1ff) == 0x163),"(archive_entry_mode(ae) & 0777) == 0543"
                   ,(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_60);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                   ,L'Č',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  wVar2 = archive_entry_acl_reset(local_60,L'Ȁ');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                      ,L'Ď',6,"6",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_DEFAULT)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
             ,L'Đ',local_60,(archive_test_acl_t *)acls2,L'\x06',L'Ȁ',L'b');
  mVar3 = archive_entry_mode(local_60);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar3 & 0x1ff));
  mVar3 = archive_entry_mode(local_60);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                   ,L'ē',(uint)((mVar3 & 0x1ff) == 0x62),"(archive_entry_mode(ae) & 0777) == 0142",
                   (void *)0x0);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                      ,L'Ė',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_star_acl.c"
                      ,L'ė',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_compat_star_acl_posix1e)
{
	char name[] = "test_compat_star_acl_posix1e.tar";
	struct archive *a;
	struct archive_entry *ae;

	/* Read archive file */
	assert(NULL != (a = archive_read_new()));
        assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
        assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
        extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name,
	    10240));

	/* First item has a few ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	failure("One extended ACL should flag all ACLs to be returned.");
	assertEqualInt(5, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	assertEntryCompareAcls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS, 0142);
	failure("Basic ACLs should set mode to 0142, not %04o",
	    (unsigned int)archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);

	/* Second item has pretty extensive ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualInt(7, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	assertEntryCompareAcls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS, 0543);
	failure("Basic ACLs should set mode to 0543, not %04o",
	    (unsigned int)archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0543);

	/* Third item has default ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualInt(6, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT));
	assertEntryCompareAcls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT, 0142);
	failure("Basic ACLs should set mode to 0142, not %04o",
	    (unsigned int)archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}